

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O2

R2Rect * __thiscall R2Rect::Expanded(R2Rect *__return_storage_ptr__,R2Rect *this,R2Point *margin)

{
  double dVar1;
  double dVar2;
  R1Interval yy;
  R1Interval xx;
  R1Interval local_38;
  R1Interval local_28;
  
  local_28 = R1Interval::Expanded(this->bounds_,margin->c_[0]);
  dVar2 = local_28.bounds_.c_[1];
  dVar1 = local_28.bounds_.c_[0];
  local_38 = R1Interval::Expanded(this->bounds_ + 1,margin->c_[1]);
  if ((dVar2 < dVar1) || (local_38.bounds_.c_[1] < local_38.bounds_.c_[0])) {
    Empty();
  }
  else {
    R2Rect(__return_storage_ptr__,&local_28,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

R2Rect R2Rect::Expanded(const R2Point& margin) const {
  R1Interval xx = x().Expanded(margin.x());
  R1Interval yy = y().Expanded(margin.y());
  if (xx.is_empty() || yy.is_empty()) return Empty();
  return R2Rect(xx, yy);
}